

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O3

size_t __thiscall
OpenMesh::PropertyT<OpenMesh::VectorT<unsigned_char,_3>_>::restore
          (PropertyT<OpenMesh::VectorT<unsigned_char,_3>_> *this,istream *_istr,bool _swap)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined7 in_register_00000011;
  long lVar2;
  ulong uVar3;
  size_t sVar4;
  
  iVar1 = (*(this->super_BaseProperty)._vptr_BaseProperty[0xb])
                    (this,_istr,CONCAT71(in_register_00000011,_swap));
  if (CONCAT44(extraout_var,iVar1) == 0) {
    sVar4 = 0;
  }
  else {
    lVar2 = 0;
    uVar3 = 0;
    sVar4 = 0;
    do {
      std::istream::read((char *)_istr,
                         (long)((((this->data_).
                                  super__Vector_base<OpenMesh::VectorT<unsigned_char,_3>,_std::allocator<OpenMesh::VectorT<unsigned_char,_3>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super_VectorDataT<unsigned_char,_3>).values_ + lVar2));
      sVar4 = sVar4 + (ulong)(*(int *)(_istr + *(long *)(*(long *)_istr + -0x18) + 0x20) == 0) * 3;
      uVar3 = uVar3 + 1;
      iVar1 = (*(this->super_BaseProperty)._vptr_BaseProperty[0xb])(this);
      lVar2 = lVar2 + 3;
    } while (uVar3 < CONCAT44(extraout_var_00,iVar1));
  }
  return sVar4;
}

Assistant:

virtual size_t restore( std::istream& _istr, bool _swap )
  {
    if ( IO::is_streamable<vector_type>() )
      return IO::restore(_istr, data_, _swap );
    size_t bytes = 0;
    for (size_t i=0; i<n_elements(); ++i)
      bytes += IO::restore( _istr, data_[i], _swap );
    return bytes;
  }